

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reformat.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  yajl_status yVar2;
  yajl_gen g_00;
  yajl_handle h;
  size_t sVar3;
  yajl_gen pyVar4;
  uchar *puVar5;
  long in_RSI;
  int in_EDI;
  uchar *str;
  size_t len;
  uchar *buf;
  uint i;
  int a;
  int retval;
  size_t rd;
  yajl_status stat;
  yajl_gen g;
  yajl_handle hand;
  size_t *in_stack_ffffffffffffff88;
  yajl_handle in_stack_ffffffffffffff90;
  yajl_gen in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 uVar6;
  yajl_alloc_funcs *in_stack_ffffffffffffffa8;
  yajl_alloc_funcs *in_stack_ffffffffffffffb0;
  yajl_callbacks *in_stack_ffffffffffffffb8;
  uint local_3c;
  int local_38;
  uint local_34;
  
  local_34 = 0;
  local_38 = 1;
  g_00 = yajl_gen_alloc(in_stack_ffffffffffffffa8);
  yajl_gen_config(g_00,yajl_gen_beautify);
  yajl_gen_config(g_00,yajl_gen_validate_utf8,1);
  h = yajl_alloc(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  yajl_config(h,yajl_allow_comments);
  while( true ) {
    uVar6 = false;
    if ((local_38 < in_EDI) && (uVar6 = false, **(char **)(in_RSI + (long)local_38 * 8) == '-')) {
      sVar3 = strlen(*(char **)(in_RSI + (long)local_38 * 8));
      uVar6 = 1 < sVar3;
    }
    if ((bool)uVar6 == false) break;
    local_3c = 1;
    while( true ) {
      in_stack_ffffffffffffff98 = (yajl_gen)(ulong)local_3c;
      pyVar4 = (yajl_gen)strlen(*(char **)(in_RSI + (long)local_38 * 8));
      if (pyVar4 <= in_stack_ffffffffffffff98) break;
      in_stack_ffffffffffffff90 =
           (yajl_handle)
           (ulong)((int)*(char *)(*(long *)(in_RSI + (long)local_38 * 8) + (ulong)local_3c) - 0x65);
      switch(in_stack_ffffffffffffff90) {
      case (yajl_handle)0x0:
        yajl_gen_config(g_00,yajl_gen_escape_solidus,1);
        break;
      default:
        fprintf(_stderr,"unrecognized option: \'%c\'\n\n",
                (ulong)(uint)(int)*(char *)(*(long *)(in_RSI + (long)local_38 * 8) + (ulong)local_3c
                                           ));
        usage((char *)0x102434);
        break;
      case (yajl_handle)0x8:
        yajl_gen_config(g_00,yajl_gen_beautify,0);
        break;
      case (yajl_handle)0xe:
        yajl_config(h,yajl_allow_multiple_values,1);
        s_streamReformat = 1;
        break;
      case (yajl_handle)0x10:
        yajl_config(h,yajl_dont_validate_strings,1);
      }
      local_3c = local_3c + 1;
    }
    local_38 = local_38 + 1;
  }
  if (local_38 < in_EDI) {
    usage((char *)0x10246d);
  }
  while (sVar3 = fread(main::fileData,1,0xffff,_stdin), sVar3 != 0) {
    main::fileData[sVar3] = '\0';
    yVar2 = yajl_parse((yajl_handle)CONCAT17(uVar6,in_stack_ffffffffffffffa0),
                       (uchar *)in_stack_ffffffffffffff98,(size_t)in_stack_ffffffffffffff90);
    if (yVar2 != yajl_status_ok) goto LAB_00102546;
    yajl_gen_get_buf(in_stack_ffffffffffffff98,(uchar **)in_stack_ffffffffffffff90,
                     in_stack_ffffffffffffff88);
    fwrite(in_stack_ffffffffffffffb8,1,(size_t)in_stack_ffffffffffffffb0,_stdout);
    yajl_gen_clear((yajl_gen)0x102541);
  }
  iVar1 = feof(_stdin);
  if (iVar1 == 0) {
    fprintf(_stderr,"error on file read.\n");
  }
  local_34 = (uint)(iVar1 == 0);
LAB_00102546:
  iVar1 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  yVar2 = yajl_complete_parse((yajl_handle)0x102550);
  if (yVar2 != yajl_status_ok) {
    puVar5 = yajl_get_error((yajl_handle)CONCAT17(uVar6,in_stack_ffffffffffffffa0),iVar1,
                            (uchar *)in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88);
    fprintf(_stderr,"%s",puVar5);
    yajl_free_error(in_stack_ffffffffffffff90,(uchar *)in_stack_ffffffffffffff88);
    local_34 = 1;
  }
  yajl_gen_free((yajl_gen)0x1025b9);
  yajl_free((yajl_handle)0x1025c3);
  return local_34;
}

Assistant:

int
main(int argc, char ** argv)
{
    yajl_handle hand;
    static unsigned char fileData[65536];
    /* generator config */
    yajl_gen g;
    yajl_status stat;
    size_t rd;
    int retval = 0;
    int a = 1;

    g = yajl_gen_alloc(NULL);
    yajl_gen_config(g, yajl_gen_beautify, 1);
    yajl_gen_config(g, yajl_gen_validate_utf8, 1);

    /* ok.  open file.  let's read and parse */
    hand = yajl_alloc(&callbacks, NULL, (void *) g);
    /* and let's allow comments by default */
    yajl_config(hand, yajl_allow_comments, 1);

    /* check arguments.*/
    while ((a < argc) && (argv[a][0] == '-') && (strlen(argv[a]) > 1)) {
        unsigned int i;
        for ( i=1; i < strlen(argv[a]); i++) {
            switch (argv[a][i]) {
                case 'm':
                    yajl_gen_config(g, yajl_gen_beautify, 0);
                    break;
                case 's':
                    yajl_config(hand, yajl_allow_multiple_values, 1);
                    s_streamReformat = 1;
                    break;
                case 'u':
                    yajl_config(hand, yajl_dont_validate_strings, 1);
                    break;
                case 'e':
                    yajl_gen_config(g, yajl_gen_escape_solidus, 1);
                    break;
                default:
                    fprintf(stderr, "unrecognized option: '%c'\n\n",
                            argv[a][i]);
                    usage(argv[0]);
            }
        }
        ++a;
    }
    if (a < argc) {
        usage(argv[0]);
    }


    for (;;) {
        rd = fread((void *) fileData, 1, sizeof(fileData) - 1, stdin);

        if (rd == 0) {
            if (!feof(stdin)) {
                fprintf(stderr, "error on file read.\n");
                retval = 1;
            }
            break;
        }
        fileData[rd] = 0;

        stat = yajl_parse(hand, fileData, rd);

        if (stat != yajl_status_ok) break;

        {
            const unsigned char * buf;
            size_t len;
            yajl_gen_get_buf(g, &buf, &len);
            fwrite(buf, 1, len, stdout);
            yajl_gen_clear(g);
        }
    }

    stat = yajl_complete_parse(hand);

    if (stat != yajl_status_ok) {
        unsigned char * str = yajl_get_error(hand, 1, fileData, rd);
        fprintf(stderr, "%s", (const char *) str);
        yajl_free_error(hand, str);
        retval = 1;
    }

    yajl_gen_free(g);
    yajl_free(hand);

    return retval;
}